

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O1

LispPTR deleteblock(LispPTR base)

{
  DLword *pDVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  DLword *pDVar5;
  DLword *pDVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  
  uVar7 = (ulong)base;
  if ((base & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar7);
  }
  pDVar1 = Lisp_world;
  if (3 < Lisp_world[uVar7]) {
    uVar3 = *(uint *)(Lisp_world + uVar7 + 2);
    if ((ulong)uVar3 != 0) {
      if ((uVar3 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
      }
      pDVar5 = Lisp_world;
      uVar4 = *(uint *)(pDVar1 + uVar7 + 4);
      if ((uVar4 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
      }
      pDVar6 = Lisp_world;
      uVar2 = pDVar1[uVar7];
      uVar7 = (ulong)uVar2;
      uVar11 = (uint)uVar2;
      uVar9 = (uint)uVar2;
      if (2 < uVar11) {
        uVar11 = 1;
        uVar8 = (ulong)uVar9;
        do {
          uVar11 = uVar11 + 1;
          uVar8 = uVar8 >> 1;
        } while ((int)uVar8 != 1);
      }
      iVar10 = 0x3c;
      if ((int)uVar11 < 0x1f) {
        if (2 < uVar2) {
          uVar9 = 1;
          do {
            uVar9 = uVar9 + 1;
            uVar7 = uVar7 >> 1;
          } while ((int)uVar7 != 1);
        }
        iVar10 = uVar9 * 2;
      }
      uVar11 = iVar10 + (*FreeBlockBuckets_word & 0xfffffff);
      if ((*FreeBlockBuckets_word & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar11);
      }
      if (uVar3 == base) {
        if ((*(uint *)(Lisp_world + uVar11) & 0xfffffff) == base) {
          pDVar1 = Lisp_world + uVar11;
          pDVar1[0] = 0;
          pDVar1[1] = 0;
        }
        else {
          error("GC error:deleting last list # FREEBLOCKLIST\n");
        }
      }
      else {
        if ((*(uint *)(Lisp_world + uVar11) & 0xfffffff) == base) {
          *(uint *)(Lisp_world + uVar11) = uVar3;
        }
        *(uint *)(pDVar5 + (ulong)uVar3 + 4) = uVar4;
        *(uint *)(pDVar6 + (ulong)uVar4 + 2) = uVar3;
      }
    }
  }
  return 0;
}

Assistant:

LispPTR deleteblock(LispPTR base) {
  struct arrayblock *bbase, *fbbase, *bbbase;
  LispPTR fwd, bkwd, fbl, freeblocklsp;
  LispPTR *freeblock;
  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  if ((bbase->arlen >= MINARRAYBLOCKSIZE) && (bbase->fwd != NIL)) {
    fwd = bbase->fwd;
    fbbase = (struct arrayblock *)NativeAligned4FromLAddr(fwd);
    bkwd = bbase->bkwd;
    bbbase = (struct arrayblock *)NativeAligned4FromLAddr(bkwd);
    fbl = FreeBlockChainN(bbase->arlen);
    freeblock = (LispPTR *)NativeAligned4FromLAddr(fbl);
    freeblocklsp = POINTERMASK & *freeblock;
    if (base == fwd) {
      if (base == freeblocklsp)
        *freeblock = NIL;
      else
        error("GC error:deleting last list # FREEBLOCKLIST\n");
      return (NIL);
    } else if (base == freeblocklsp)
      *freeblock = fwd;
    fbbase->bkwd = bkwd;
    bbbase->fwd = fwd;
  }
  return (NIL);
}